

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O2

int av1_get_refresh_frame_flags
              (AV1_COMP *cpi,EncodeFrameParams *frame_params,FRAME_UPDATE_TYPE frame_update_type,
              int gf_index,int cur_disp_order,RefFrameMapPair *ref_frame_map_pairs)

{
  ExtRefreshFrameFlagsInfo *ext_refresh_frame_flags;
  byte bVar1;
  AV1_PRIMARY *pAVar2;
  uint i;
  int iVar3;
  long lVar4;
  uint uVar5;
  
  pAVar2 = cpi->ppi;
  uVar5 = 0xff;
  if (((pAVar2->gf_group).refbuf_state[gf_index] != '\0') && (frame_params->frame_type != '\x03')) {
    uVar5 = 0;
    if (frame_params->show_existing_frame == 0) {
      ext_refresh_frame_flags = &(cpi->ext_flags).refresh_frame;
      iVar3 = is_frame_droppable(&pAVar2->rtc_ref,ext_refresh_frame_flags);
      uVar5 = 0;
      if (iVar3 == 0) {
        if ((cpi->use_ducky_encode == 0) || ((cpi->ducky_encode_info).frame_info.gop_mode != '\x01')
           ) {
          if ((cpi->ext_flags).refresh_frame.update_pending == true) {
            if (((pAVar2->rtc_ref).set_ref_frame_config == 0) &&
               (iVar3 = use_rtc_reference_structure_one_layer(cpi), iVar3 == 0)) {
              iVar3 = (cpi->common).remapped_ref_idx[0];
              if (iVar3 == -1) {
                uVar5 = 0;
              }
              else {
                uVar5 = (uint)ext_refresh_frame_flags->last_frame << ((byte)iVar3 & 0x1f);
              }
              iVar3 = (cpi->common).remapped_ref_idx[7];
              if (iVar3 != -1) {
                uVar5 = uVar5 | (uint)(cpi->ext_flags).refresh_frame.bwd_ref_frame <<
                                ((byte)iVar3 & 0x1f);
              }
              iVar3 = (cpi->common).remapped_ref_idx[5];
              if (iVar3 != -1) {
                uVar5 = uVar5 | (uint)(cpi->ext_flags).refresh_frame.alt2_ref_frame <<
                                ((byte)iVar3 & 0x1f);
              }
              if (frame_update_type == '\x04') {
                iVar3 = (cpi->common).remapped_ref_idx[6];
                if (iVar3 == -1) {
                  return uVar5;
                }
                bVar1 = (cpi->ext_flags).refresh_frame.golden_frame;
              }
              else {
                iVar3 = (cpi->common).remapped_ref_idx[3];
                if (iVar3 != -1) {
                  uVar5 = uVar5 | (uint)(cpi->ext_flags).refresh_frame.golden_frame <<
                                  ((byte)iVar3 & 0x1f);
                }
                iVar3 = (cpi->common).remapped_ref_idx[6];
                if (iVar3 == -1) {
                  return uVar5;
                }
                bVar1 = (cpi->ext_flags).refresh_frame.alt_ref_frame;
              }
              uVar5 = uVar5 | (uint)bVar1 << ((byte)iVar3 & 0x1f);
            }
            else {
              uVar5 = 0;
              for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
                iVar3 = (pAVar2->rtc_ref).ref_idx[lVar4];
                uVar5 = uVar5 | (pAVar2->rtc_ref).refresh[iVar3] << ((byte)iVar3 & 0x1f);
              }
            }
          }
          else {
            iVar3 = get_free_ref_map_index(ref_frame_map_pairs);
            if ((frame_update_type & 0xfe) != 4) {
              if (iVar3 == -1) {
                uVar5 = is_one_pass_rt_params(cpi);
                iVar3 = get_refresh_idx(ref_frame_map_pairs,(uint)(frame_update_type == '\x03'),
                                        &pAVar2->gf_group,gf_index,uVar5 ^ 1,cur_disp_order);
              }
              uVar5 = 1 << ((byte)iVar3 & 0x1f);
            }
          }
        }
        else {
          iVar3 = (pAVar2->gf_group).update_ref_idx[gf_index];
          uVar5 = 0;
          if (iVar3 != -1) {
            uVar5 = 1 << ((byte)iVar3 & 0x1f);
          }
        }
      }
    }
  }
  return uVar5;
}

Assistant:

int av1_get_refresh_frame_flags(
    const AV1_COMP *const cpi, const EncodeFrameParams *const frame_params,
    FRAME_UPDATE_TYPE frame_update_type, int gf_index, int cur_disp_order,
    RefFrameMapPair ref_frame_map_pairs[REF_FRAMES]) {
  const AV1_COMMON *const cm = &cpi->common;
  const ExtRefreshFrameFlagsInfo *const ext_refresh_frame_flags =
      &cpi->ext_flags.refresh_frame;

  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  if (gf_group->refbuf_state[gf_index] == REFBUF_RESET)
    return SELECT_ALL_BUF_SLOTS;

  // TODO(jingning): Deprecate the following operations.
  // Switch frames and shown key-frames overwrite all reference slots
  if (frame_params->frame_type == S_FRAME) return SELECT_ALL_BUF_SLOTS;

  // show_existing_frames don't actually send refresh_frame_flags so set the
  // flags to 0 to keep things consistent.
  if (frame_params->show_existing_frame) return 0;

  const RTC_REF *const rtc_ref = &cpi->ppi->rtc_ref;
  if (is_frame_droppable(rtc_ref, ext_refresh_frame_flags)) return 0;

#if !CONFIG_REALTIME_ONLY
  if (cpi->use_ducky_encode &&
      cpi->ducky_encode_info.frame_info.gop_mode == DUCKY_ENCODE_GOP_MODE_RCL) {
    int new_fb_map_idx = cpi->ppi->gf_group.update_ref_idx[gf_index];
    if (new_fb_map_idx == INVALID_IDX) return 0;
    return 1 << new_fb_map_idx;
  }
#endif  // !CONFIG_REALTIME_ONLY

  int refresh_mask = 0;
  if (ext_refresh_frame_flags->update_pending) {
    if (rtc_ref->set_ref_frame_config ||
        use_rtc_reference_structure_one_layer(cpi)) {
      for (unsigned int i = 0; i < INTER_REFS_PER_FRAME; i++) {
        int ref_frame_map_idx = rtc_ref->ref_idx[i];
        refresh_mask |= rtc_ref->refresh[ref_frame_map_idx]
                        << ref_frame_map_idx;
      }
      return refresh_mask;
    }
    // Unfortunately the encoder interface reflects the old refresh_*_frame
    // flags so we have to replicate the old refresh_frame_flags logic here in
    // order to preserve the behaviour of the flag overrides.
    int ref_frame_map_idx = get_ref_frame_map_idx(cm, LAST_FRAME);
    if (ref_frame_map_idx != INVALID_IDX)
      refresh_mask |= ext_refresh_frame_flags->last_frame << ref_frame_map_idx;

    ref_frame_map_idx = get_ref_frame_map_idx(cm, EXTREF_FRAME);
    if (ref_frame_map_idx != INVALID_IDX)
      refresh_mask |= ext_refresh_frame_flags->bwd_ref_frame
                      << ref_frame_map_idx;

    ref_frame_map_idx = get_ref_frame_map_idx(cm, ALTREF2_FRAME);
    if (ref_frame_map_idx != INVALID_IDX)
      refresh_mask |= ext_refresh_frame_flags->alt2_ref_frame
                      << ref_frame_map_idx;

    if (frame_update_type == OVERLAY_UPDATE) {
      ref_frame_map_idx = get_ref_frame_map_idx(cm, ALTREF_FRAME);
      if (ref_frame_map_idx != INVALID_IDX)
        refresh_mask |= ext_refresh_frame_flags->golden_frame
                        << ref_frame_map_idx;
    } else {
      ref_frame_map_idx = get_ref_frame_map_idx(cm, GOLDEN_FRAME);
      if (ref_frame_map_idx != INVALID_IDX)
        refresh_mask |= ext_refresh_frame_flags->golden_frame
                        << ref_frame_map_idx;

      ref_frame_map_idx = get_ref_frame_map_idx(cm, ALTREF_FRAME);
      if (ref_frame_map_idx != INVALID_IDX)
        refresh_mask |= ext_refresh_frame_flags->alt_ref_frame
                        << ref_frame_map_idx;
    }
    return refresh_mask;
  }

  // Search for the open slot to store the current frame.
  int free_fb_index = get_free_ref_map_index(ref_frame_map_pairs);

  // No refresh necessary for these frame types.
  if (frame_update_type == OVERLAY_UPDATE ||
      frame_update_type == INTNL_OVERLAY_UPDATE)
    return refresh_mask;

  // If there is an open slot, refresh that one instead of replacing a
  // reference.
  if (free_fb_index != INVALID_IDX) {
    refresh_mask = 1 << free_fb_index;
    return refresh_mask;
  }
  const int enable_refresh_skip = !is_one_pass_rt_params(cpi);
  const int update_arf = frame_update_type == ARF_UPDATE;
  const int refresh_idx =
      get_refresh_idx(ref_frame_map_pairs, update_arf, &cpi->ppi->gf_group,
                      gf_index, enable_refresh_skip, cur_disp_order);
  return 1 << refresh_idx;
}